

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

void __thiscall absl::lts_20250127::uint128::uint128(uint128 *this,longdouble v)

{
  uint128 uVar1;
  uint64_t local_38;
  uint64_t local_30;
  longdouble v_local;
  uint128 *this_local;
  
  uVar1 = anon_unknown_2::MakeUint128FromFloat<long_double>(v);
  local_38 = uVar1.lo_;
  this->lo_ = local_38;
  local_30 = uVar1.hi_;
  this->hi_ = local_30;
  return;
}

Assistant:

uint128::uint128(long double v) : uint128(MakeUint128FromFloat(v)) {}